

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O3

int parser_bare_item(sf_parser *sfp,sf_value *dest)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *base;
  uint8_t *puVar3;
  
  puVar1 = sfp->pos;
  iVar2 = -1;
  switch(*puVar1) {
  case '\"':
    iVar2 = parser_string(sfp,dest);
    return iVar2;
  case '*':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case 'a':
  case 'b':
  case 'c':
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 's':
  case 't':
  case 'u':
  case 'v':
  case 'w':
  case 'x':
  case 'y':
  case 'z':
    puVar3 = puVar1 + 1;
    sfp->pos = puVar3;
    if (puVar3 != sfp->end) {
LAB_001171fa:
      switch(*puVar3) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '^':
      case '_':
      case '`':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '|':
      case '~':
        goto switchD_0011720f_caseD_21;
      default:
        break;
      }
    }
switchD_0011720f_caseD_22:
    iVar2 = 0;
    if (dest != (sf_value *)0x0) {
      dest->type = SF_TYPE_TOKEN;
      dest->flags = 0;
      (dest->field_2).vec.base = puVar1;
      (dest->field_2).decimal.denom = (long)sfp->pos - (long)puVar1;
    }
    break;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    iVar2 = parser_number(sfp,dest);
    return iVar2;
  case ':':
    iVar2 = parser_byteseq(sfp,dest);
    return iVar2;
  case '?':
    iVar2 = parser_boolean(sfp,dest);
    return iVar2;
  case '@':
    iVar2 = parser_date(sfp,dest);
    return iVar2;
  }
  return iVar2;
switchD_0011720f_caseD_21:
  puVar3 = puVar3 + 1;
  sfp->pos = puVar3;
  if (puVar3 == sfp->end) goto switchD_0011720f_caseD_22;
  goto LAB_001171fa;
}

Assistant:

static int parser_bare_item(sf_parser *sfp, sf_value *dest) {
  switch (*sfp->pos) {
  case '"':
    return parser_string(sfp, dest);
  case '-':
  DIGIT_CASES:
    return parser_number(sfp, dest);
  case '@':
    return parser_date(sfp, dest);
  case ':':
    return parser_byteseq(sfp, dest);
  case '?':
    return parser_boolean(sfp, dest);
  case '*':
  ALPHA_CASES:
    return parser_token(sfp, dest);
  default:
    return SF_ERR_PARSE_ERROR;
  }
}